

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O1

void canvas_statesavers_doit(_glist *x,_binbuf *b)

{
  _glist *x_00;
  t_pd p_Var1;
  int iVar2;
  
  for (x_00 = (_glist *)x->gl_list; x_00 != (_glist *)0x0;
      x_00 = (_glist *)(x_00->gl_obj).te_g.g_next) {
    p_Var1 = (x_00->gl_obj).te_g.g_pd;
    if (p_Var1 == savestate_class) {
      *(_binbuf **)&x_00->gl_valid = b;
      outlet_bang((_outlet *)x_00->gl_stub);
      *(undefined8 *)&x_00->gl_valid = 0;
    }
    else if ((p_Var1 == canvas_class) && (iVar2 = canvas_isabstraction(x_00), iVar2 == 0)) {
      canvas_statesavers_doit(x_00,b);
    }
  }
  return;
}

Assistant:

void canvas_statesavers_doit(t_glist *x, t_binbuf *b)
{
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
        if (g->g_pd == savestate_class)
            savestate_doit((t_savestate *)g, b);
        else if (g->g_pd == canvas_class && !canvas_isabstraction((t_canvas *)g))
            canvas_statesavers_doit((t_glist *)g, b);
}